

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference pbVar4;
  ostream *poVar5;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  undefined1 local_338 [8];
  ostringstream emsg;
  string local_1b8;
  undefined1 local_198 [8];
  string command;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  const_iterator it;
  value_type local_158;
  allocator local_131;
  value_type local_130;
  allocator local_109;
  undefined1 local_108 [8];
  string tmp;
  string local_e0;
  char *local_c0;
  char *config;
  value_type local_b0;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchDirs;
  string local_70;
  allocator local_39;
  string local_38 [8];
  string tmpOutputFile;
  string *targetName_local;
  cmCoreTryCompile *this_local;
  
  tmpOutputFile.field_2._8_8_ = targetName;
  std::__cxx11::string::operator=((string *)&this->FindErrorMessage,"");
  std::__cxx11::string::operator=((string *)&this->OutputFile,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,(string *)tmpOutputFile.field_2._8_8_);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"CMAKE_EXECUTABLE_SUFFIX",
             (allocator *)
             ((long)&searchDirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_70);
  std::__cxx11::string::operator+=(local_38,pcVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&searchDirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"",(allocator *)((long)&config + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"CMAKE_TRY_COMPILE_CONFIGURATION",
             (allocator *)(tmp.field_2._M_local_buf + 0xf));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
  local_c0 = pcVar3;
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_108,"/",&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::operator+=((string *)local_108,local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_90,(value_type *)local_108);
    std::__cxx11::string::~string((string *)local_108);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"/Debug",&local_131);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,"/Development",(allocator *)((long)&it._M_current + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_170._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_168,&local_170);
  while( true ) {
    command.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90);
    bVar2 = __gnu_cxx::operator!=
                      (&local_168,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&command.field_2 + 8));
    if (!bVar2) break;
    std::__cxx11::string::string((string *)local_198,(string *)&this->BinaryDirectory);
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_168);
    std::__cxx11::string::operator+=((string *)local_198,(string *)pbVar4);
    std::__cxx11::string::operator+=((string *)local_198,local_38);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath(&local_1b8,(string *)local_198);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    std::__cxx11::string::~string((string *)local_198);
    if (bVar2) goto LAB_004dbee6;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_168);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
  std::operator<<((ostream *)local_338,"Unable to find the executable at any of:\n");
  std::operator+(&local_378,"  ",&this->BinaryDirectory);
  std::__cxx11::string::string((string *)&local_398,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"\n",&local_3b9);
  cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_358,&local_378,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90,&local_398,&local_3b8);
  poVar5 = std::operator<<((ostream *)local_338,(string *)&local_358);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->FindErrorMessage,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
LAB_004dbee6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_90);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage = "";
  this->OutputFile = "";
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;
  tmpOutputFile +=this->Makefile->GetSafeDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // a list of directories where to search for the compilation result
  // at first directly in the binary dir
  std::vector<std::string> searchDirs;
  searchDirs.push_back("");

  const char* config = this->Makefile->GetDefinition(
                                            "CMAKE_TRY_COMPILE_CONFIGURATION");
  // if a config was specified try that first
  if (config && config[0])
    {
    std::string tmp = "/";
    tmp += config;
    searchDirs.push_back(tmp);
    }
  searchDirs.push_back("/Debug");
#if defined(__APPLE__)
  std::string app = "/Debug/" + targetName + ".app";
  searchDirs.push_back(app);
#endif
  searchDirs.push_back("/Development");

  for(std::vector<std::string>::const_iterator it = searchDirs.begin();
      it != searchDirs.end();
      ++it)
    {
    std::string command = this->BinaryDirectory;
    command += *it;
    command += tmpOutputFile;
    if(cmSystemTools::FileExists(command.c_str()))
      {
      this->OutputFile = cmSystemTools::CollapseFullPath(command);
      return;
      }
    }

  std::ostringstream emsg;
  emsg << "Unable to find the executable at any of:\n";
  emsg << cmWrap("  " + this->BinaryDirectory,
                 searchDirs,
                 tmpOutputFile, "\n") << "\n";
  this->FindErrorMessage = emsg.str();
  return;
}